

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::SooRep::set_non_soo
          (SooRep *this,bool was_soo,int capacity,void *elements)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint index;
  uint extraout_EAX_01;
  ulong *puVar4;
  ulong *extraout_RAX;
  uint size;
  uint extraout_EDX;
  uint extraout_EDX_00;
  char cVar5;
  int iVar6;
  undefined1 *puVar7;
  LongSooRep *this_00;
  SooRep *pSVar8;
  RepeatedPtrFieldBase *pRVar9;
  long *plVar10;
  undefined1 auStack_e0 [8];
  undefined8 uStack_d8;
  undefined1 auStack_c8 [8];
  undefined8 uStack_c0;
  undefined1 auStack_b0 [8];
  code *pcStack_a8;
  undefined1 auStack_70 [8];
  code *pcStack_68;
  undefined8 uStack_50;
  undefined1 auStack_40 [24];
  LongSooRep LStack_28;
  SooRep local_10;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == was_soo) {
    if (elements == (void *)0x0) goto LAB_001d680e;
    puVar4 = (ulong *)((ulong)elements & 7);
    if (puVar4 == (ulong *)0x0) {
      if (was_soo) {
        (this->field_0).long_rep.size = (uint)uVar1 & 3;
      }
      (this->field_0).long_rep.capacity = capacity;
      (this->field_0).long_rep.elements_int = (ulong)elements | 4;
      return;
    }
  }
  else {
    LStack_28.size = 0x1d680e;
    LStack_28.capacity = 0;
    set_non_soo();
LAB_001d680e:
    LStack_28.size = 0x1d6818;
    LStack_28.capacity = 0;
    set_non_soo(&local_10);
    puVar4 = extraout_RAX;
  }
  iVar6 = (int)&local_10;
  LStack_28.size = 0x1d6825;
  LStack_28.capacity = 0;
  set_non_soo();
  if ((*puVar4 & 4) == 0) {
    return;
  }
  this_00 = &LStack_28;
  auStack_40._8_8_ = RepeatedField<int>::heap_rep;
  soo_arena();
  if ((this_00->elements_int & 4) != 0) {
    uStack_50 = 0x1d684e;
    LongSooRep::elements(this_00);
    return;
  }
  pSVar8 = (SooRep *)auStack_40;
  uStack_50 = 0x1d6861;
  RepeatedField<int>::heap_rep();
  iVar2 = 2;
  if (iVar6 == 0) {
    iVar2 = (pSVar8->field_0).long_rep.capacity;
  }
  if ((int)size <= iVar2) {
    set_size(pSVar8,SUB41(iVar6,0),size);
    return;
  }
  puVar4 = (ulong *)(ulong)size;
  cVar5 = (char)iVar2;
  pcStack_68 = set_size;
  RepeatedField<int>::set_size();
  if (((*puVar4 & 4) == 0) == (bool)cVar5) {
    if (cVar5 == '\0') {
      *(uint *)(puVar4 + 1) = extraout_EDX;
    }
    else {
      uVar3 = extraout_EDX;
      if (3 < (int)extraout_EDX) goto LAB_001d68db;
      *puVar4 = (long)(int)extraout_EDX | *puVar4 & 0xfffffffffffffff8;
    }
    return;
  }
  set_size();
  uVar3 = extraout_EDX_00;
LAB_001d68db:
  puVar7 = auStack_70;
  pSVar8 = (SooRep *)(ulong)uVar3;
  set_size();
  if ((int)puVar7 < 0) {
    pcStack_a8 = (code *)0x1d6936;
    RepeatedField<int>::Mutable();
    uVar3 = extraout_EAX;
  }
  else {
    pcStack_a8 = (code *)0x1d6906;
    uVar3 = SooRep::size(pSVar8,(undefined1  [16])
                                ((undefined1  [16])pSVar8->field_0 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
    if ((int)puVar7 < (int)uVar3) {
      pcStack_a8 = (code *)0x1d691c;
      RepeatedField<int>::elements
                ((RepeatedField<int> *)pSVar8,
                 (undefined1  [16])((undefined1  [16])pSVar8->field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)((ulong)puVar7 & 0xffffffff);
  pcStack_a8 = RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
  ;
  RepeatedField<int>::Mutable();
  if ((int)uVar3 < 0) {
    uVar3 = (uint)auStack_b0;
    uStack_c0 = 0x1d696f;
    RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
    index = extraout_EAX_00;
  }
  else {
    index = pRVar9->current_size_;
    if ((int)uVar3 < (int)index) {
      uStack_c0 = 0x1d6958;
      RepeatedPtrFieldBase::element_at(pRVar9,uVar3);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)(ulong)uVar3;
  uStack_c0 = 0x1d697d;
  RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>();
  if ((int)index < 0) {
    index = (uint)auStack_c8;
    uStack_d8 = 0x1d69a9;
    RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
              ();
    uVar3 = extraout_EAX_01;
  }
  else {
    uVar3 = pRVar9->current_size_;
    if ((int)index < (int)uVar3) {
      uStack_d8 = 0x1d6992;
      RepeatedPtrFieldBase::element_at(pRVar9,index);
      return;
    }
  }
  pRVar9 = (RepeatedPtrFieldBase *)(ulong)index;
  uStack_d8 = 0x1d69b7;
  RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
            ();
  if ((int)uVar3 < 0) {
    uVar3 = (uint)auStack_e0;
    RepeatedPtrFieldBase::
    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
              ();
  }
  else if ((int)uVar3 < pRVar9->current_size_) {
    RepeatedPtrFieldBase::element_at(pRVar9,uVar3);
    return;
  }
  plVar10 = (long *)(ulong)uVar3;
  RepeatedPtrFieldBase::
  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>();
  if (*plVar10 == 1) {
    return;
  }
  if (*plVar10 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  __assert_fail("is_soo()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xf7c,
                "slot_type *absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::soo_slot() [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
               );
}

Assistant:

void set_non_soo(bool was_soo, int capacity, void* elements) {
    ABSL_DCHECK_EQ(was_soo, is_soo());
    ABSL_DCHECK_NE(elements, nullptr);
    ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(elements) % kSooPtrAlignment,
                   uintptr_t{0});
    if (was_soo) long_rep.size = short_rep.size();
    long_rep.capacity = capacity;
    long_rep.elements_int = reinterpret_cast<uintptr_t>(elements) | kNotSooBit;
  }